

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refzg.cc
# Opt level: O3

refzg_t * tchecker::refzg::factory
                    (shared_ptr<const_tchecker::ta::system_t> *system,sharing_type_t sharing_type,
                    reference_clock_variables_type_t refclocks_type,semantics_type_t semantics_type,
                    integer_t spread,size_t block_size,size_t table_size)

{
  system_t *system_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  refzg_t *this_00;
  invalid_argument *this_01;
  shared_ptr<const_tchecker::reference_clock_variables_t> r;
  variable_access_map_t va_map;
  shared_ptr<tchecker::refzg::semantics_t> semantics;
  
  system_00 = (system->super___shared_ptr<const_tchecker::ta::system_t,_(__gnu_cxx::_Lock_policy)2>)
              ._M_ptr;
  if (refclocks_type == PROCESS_REFERENCE_CLOCKS) {
    variable_access(&va_map,system_00);
    process_reference_clocks
              ((reference_clock_variables_t *)&semantics,&va_map,
               &(system_00->super_system_t).super_system_t.super_clocks_t._clock_variables.
                super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._flattened_variables,
               (int)((ulong)((long)*(pointer *)
                                    ((long)&(system_00->super_system_t).super_system_t.
                                            super_processes_t._procs_attributes.
                                            super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                            (long)(system_00->super_system_t).super_system_t.super_processes_t.
                                  _procs_attributes.
                                  super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249);
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x98);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0027c960;
    reference_clock_variables_t::reference_clock_variables_t
              ((reference_clock_variables_t *)(this + 1),(reference_clock_variables_t *)&semantics);
    r.super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (reference_clock_variables_t *)(this + 1);
    r.super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this;
    reference_clock_variables_t::~reference_clock_variables_t
              ((reference_clock_variables_t *)&semantics);
    if (va_map._empty_vid_set.
        super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
        .m_data.m_seq.m_holder.m_capacity != 0) {
      operator_delete(va_map._empty_vid_set.
                      super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
                      .m_data.m_seq.m_holder.m_start);
    }
    if (va_map._empty_pid_set.
        super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
        .m_data.m_seq.m_holder.m_capacity != 0) {
      operator_delete(va_map._empty_pid_set.
                      super_flat_tree<unsigned_int,_boost::move_detail::identity<unsigned_int>,_std::less<unsigned_int>,_void>
                      .m_data.m_seq.m_holder.m_start);
    }
    boost::container::
    vector<boost::container::dtl::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>,_void>
    ::~vector((vector<boost::container::dtl::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>,_void>
               *)&va_map._p2v_map);
    boost::container::
    vector<boost::container::dtl::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>,_void>
    ::~vector((vector<boost::container::dtl::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>,_boost::container::new_allocator<boost::container::dtl::pair<std::tuple<unsigned_int,_tchecker::variable_type_t,_tchecker::variable_access_t>,_boost::container::flat_set<unsigned_int,_std::less<unsigned_int>,_void>_>_>,_void>
               *)&va_map);
  }
  else {
    if (refclocks_type != SINGLE_REFERENCE_CLOCKS) {
      this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_01,"Unknown reference clock variables type");
      __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    single_reference_clocks
              ((reference_clock_variables_t *)&semantics,
               &(system_00->super_system_t).super_system_t.super_clocks_t._clock_variables.
                super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._flattened_variables,
               (int)((ulong)((long)*(pointer *)
                                    ((long)&(system_00->super_system_t).super_system_t.
                                            super_processes_t._procs_attributes.
                                            super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                                            ._M_impl.super__Vector_impl_data + 8) -
                            (long)(system_00->super_system_t).super_system_t.super_processes_t.
                                  _procs_attributes.
                                  super__Vector_base<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249);
    this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x98);
    this->_M_use_count = 1;
    this->_M_weak_count = 1;
    this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0027c960;
    reference_clock_variables_t::reference_clock_variables_t
              ((reference_clock_variables_t *)(this + 1),(reference_clock_variables_t *)&semantics);
    r.super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (reference_clock_variables_t *)(this + 1);
    r.super___shared_ptr<const_tchecker::reference_clock_variables_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this;
    reference_clock_variables_t::~reference_clock_variables_t
              ((reference_clock_variables_t *)&semantics);
  }
  semantics.super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       semantics_factory(semantics_type);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<tchecker::refzg::semantics_t*>
            (&semantics.super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             semantics.super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr);
  this_00 = (refzg_t *)operator_new(0x2f0);
  refzg_t::refzg_t(this_00,system,sharing_type,&r,&semantics,spread,block_size,table_size);
  if (semantics.super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (semantics.
               super___shared_ptr<tchecker::refzg::semantics_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return this_00;
}

Assistant:

tchecker::refzg::refzg_t * factory(std::shared_ptr<tchecker::ta::system_t const> const & system,
                                   enum tchecker::ts::sharing_type_t sharing_type,
                                   enum tchecker::refzg::reference_clock_variables_type_t refclocks_type,
                                   enum tchecker::refzg::semantics_type_t semantics_type, tchecker::integer_t spread,
                                   std::size_t block_size, std::size_t table_size)
{
  std::shared_ptr<tchecker::reference_clock_variables_t const> r(
      tchecker::refzg::reference_clocks_factory(refclocks_type, *system));
  std::shared_ptr<tchecker::refzg::semantics_t> semantics{tchecker::refzg::semantics_factory(semantics_type)};
  return new tchecker::refzg::refzg_t(system, sharing_type, r, semantics, spread, block_size, table_size);
}